

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx::createPrimRefArray_presplit<embree::TriangleMesh,embree::avx::TriangleSplitterFactory>
          (PrimInfo *__return_storage_ptr__,avx *this,Geometry *geometry,uint geomID,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  char cVar4;
  int iVar5;
  runtime_error *prVar6;
  undefined4 in_register_0000000c;
  size_t i;
  unsigned_long last;
  PrimInfoT<embree::BBox<embree::Vec3fa>_> *this_00;
  ulong uVar7;
  size_t *psVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  anon_class_1_0_00000001 local_29e1;
  size_t taskCount;
  undefined8 local_29d8;
  uint geomID_local;
  Geometry *geometry_local;
  unsigned_long *local_29c0;
  undefined8 local_29b8;
  undefined8 uStack_29b0;
  anon_class_24_3_3a534e91 *local_29a8;
  undefined8 uStack_29a0;
  mvector<PrimRef> *local_2990;
  mvector<PrimRef> *local_2988;
  long local_2980;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2978;
  undefined8 local_2968;
  undefined8 uStack_2960;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2958;
  undefined8 uStack_2950;
  undefined8 local_2948;
  undefined8 uStack_2940;
  size_t local_2938;
  size_t sStack_2930;
  anon_class_24_3_3a534e91 local_2920;
  task_group_context context;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2888;
  size_t *local_2878;
  float fStack_2870;
  float fStack_286c;
  anon_class_24_3_3a534e91 *local_2868;
  undefined8 uStack_2860;
  undefined8 local_2858;
  undefined8 uStack_2850;
  size_t local_2848;
  size_t sStack_2840;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  
  local_2980 = CONCAT44(in_register_0000000c,geomID);
  geomID_local = (uint)geometry;
  geometry_local = (Geometry *)this;
  local_2988 = prims;
  (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
  uVar1 = *(uint *)(this + 0x20);
  local_29d8 = 0;
  local_29c0 = (unsigned_long *)(ulong)uVar1;
  local_2888._0_8_ = &geometry_local;
  local_2888._8_8_ = numPrimRefs;
  local_2878 = (size_t *)&geomID_local;
  iVar5 = tbb::detail::d1::max_concurrency();
  uVar7 = (long)(ulong)uVar1 + 0x3ffU >> 10;
  if ((ulong)(long)iVar5 < uVar7) {
    uVar7 = (long)iVar5;
  }
  if (0x3f < uVar7) {
    uVar7 = 0x40;
  }
  local_2968 = &taskCount;
  local_2978._0_8_ = &local_29d8;
  uStack_2960 = &pstate;
  taskCount = uVar7;
  local_2978._8_8_ = &local_29c0;
  local_2958 = &local_2888;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_2920.geometry = (Geometry **)&local_2978;
  tbb::detail::d1::
  parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
            (0,uVar7,1,(anon_class_8_1_898bcfc2_conflict4 *)&local_2920,&context);
  cVar4 = tbb::detail::r1::is_group_execution_cancelled(&context);
  local_2990 = (mvector<PrimRef> *)numPrimRefs;
  if (cVar4 != '\0') {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"task cancelled");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  local_29a8 = (anon_class_24_3_3a534e91 *)0x7f8000007f800000;
  uStack_29a0 = 0x7f8000007f800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  local_29b8 = 0xff800000ff800000;
  uStack_29b0 = 0xff800000ff800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  this_00 = pstate.sums;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  for (uVar7 = 0; uVar7 < taskCount; uVar7 = uVar7 + 1) {
    context.my_cpu_ctl_env =
         *(uint64_t *)
          &this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0;
    context._8_8_ =
         *(undefined8 *)
          ((long)&this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                  field_0 + 8);
    context.field_6 =
         *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)
          &this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0;
    context.my_context_list =
         *(context_list **)
          ((long)&this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.
                  field_0 + 8);
    context.my_node.my_prev_node =
         *(intrusive_list_node **)
          &this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0;
    context.my_node.my_next_node =
         *(intrusive_list_node **)
          ((long)&this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.
                  field_0 + 8);
    context.my_exception._M_b._M_p =
         *(__base_type *)
          &this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0;
    context.my_itt_caller =
         *(void **)((long)&this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.
                           upper.field_0 + 8);
    context.my_name = this_00[-0x40].begin;
    context.padding._0_8_ = this_00[-0x40].end;
    PrimInfoT<embree::BBox<embree::Vec3fa>_>::operator=(this_00,__return_storage_ptr__);
    createPrimRefArray_presplit<embree::TriangleMesh,_embree::avx::TriangleSplitterFactory>::
    anon_class_1_0_00000001::operator()
              ((PrimInfo *)&local_2978.field_1,(anon_class_1_0_00000001 *)&local_2920,
               __return_storage_ptr__,(PrimInfo *)&context);
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_2978._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_2978._8_8_;
    *(size_t **)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_2968;
    *(ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> **)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = uStack_2960;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_2958;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = uStack_2950;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_2948;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = uStack_2940;
    __return_storage_ptr__->begin = local_2938;
    __return_storage_ptr__->end = sStack_2930;
    this_00 = this_00 + 1;
  }
  if (__return_storage_ptr__->end - __return_storage_ptr__->begin != local_2980) {
    (*(code *)((local_2988->alloc).device)->_vptr_MemoryMonitorInterface)(local_2988,0);
    uVar1 = geometry_local->numPrimitives;
    local_2920.geometry = &geometry_local;
    local_2920.prims = local_2990;
    local_2920.geomID = &geomID_local;
    local_29d8 = 0;
    local_29c0 = (unsigned_long *)(ulong)uVar1;
    iVar5 = tbb::detail::d1::max_concurrency();
    uVar7 = (long)(ulong)uVar1 + 0x3ffU >> 10;
    if ((ulong)(long)iVar5 < uVar7) {
      uVar7 = (long)iVar5;
    }
    last = 0x40;
    if (uVar7 < 0x40) {
      last = uVar7;
    }
    local_2978._0_8_ = &local_29d8;
    local_2978._8_8_ = &local_29c0;
    local_2968 = &taskCount;
    uStack_2960 = &pstate;
    taskCount = last;
    local_2958 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)&local_2920;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_2888._0_8_ = &local_2978;
    tbb::detail::d1::
    parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
              (0,last,1,(anon_class_8_1_898bcfc2_conflict4 *)&local_2888.field_1,&context);
    cVar4 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar4 != '\0') {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"task cancelled");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    local_2888._0_8_ = (undefined8 *)0x7f8000007f800000;
    local_2888._8_8_ = (unsigned_long **)0x7f8000007f800000;
    local_2878 = (size_t *)0xff800000ff800000;
    fStack_2870 = -INFINITY;
    fStack_286c = -INFINITY;
    local_2868 = (anon_class_24_3_3a534e91 *)0x7f8000007f800000;
    uStack_2860 = 0x7f8000007f800000;
    local_2858 = 0xff800000ff800000;
    uStack_2850 = 0xff800000ff800000;
    local_2848 = 0;
    sStack_2840 = 0;
    psVar8 = &pstate.sums[0].begin;
    uVar9 = INFINITY;
    uVar10 = INFINITY;
    uVar11 = INFINITY;
    uVar12 = INFINITY;
    fVar2 = -INFINITY;
    fVar3 = -INFINITY;
    for (uVar7 = 0; uVar7 < taskCount; uVar7 = uVar7 + 1) {
      context.my_cpu_ctl_env = psVar8[-0x288];
      context._8_8_ = psVar8[-0x287];
      context.field_6 = *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)(psVar8 + -0x286);
      context.my_context_list = (context_list *)psVar8[-0x285];
      context.my_node.my_prev_node = (intrusive_list_node *)psVar8[-0x284];
      context.my_node.my_next_node = (intrusive_list_node *)psVar8[-0x283];
      context.my_exception._M_b._M_p = (__base_type)psVar8[-0x282];
      context.my_itt_caller = (void *)psVar8[-0x281];
      context.my_name = psVar8[-0x280];
      context.padding._0_8_ = psVar8[-0x27f];
      (((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar8 + -8))->
      super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.m128[0] = (float)uVar9
      ;
      *(undefined4 *)((long)psVar8 + -0x3c) = uVar10;
      *(undefined4 *)(psVar8 + -7) = uVar11;
      *(undefined4 *)((long)psVar8 + -0x34) = uVar12;
      (((Vec3fa *)(psVar8 + -6))->field_0).m128[0] = fVar2;
      *(float *)((long)psVar8 + -0x2c) = fVar3;
      *(float *)(psVar8 + -5) = fStack_2870;
      *(float *)((long)psVar8 + -0x24) = fStack_286c;
      *(anon_class_24_3_3a534e91 **)&(((BBox3fa *)(psVar8 + -4))->lower).field_0 = local_29a8;
      psVar8[-3] = uStack_29a0;
      *(undefined8 *)&((Vec3fa *)(psVar8 + -2))->field_0 = local_29b8;
      psVar8[-1] = uStack_29b0;
      *psVar8 = local_2848;
      psVar8[1] = sStack_2840;
      createPrimRefArray_presplit<embree::TriangleMesh,_embree::avx::TriangleSplitterFactory>::
      anon_class_1_0_00000001::operator()
                ((PrimInfo *)&local_2978.field_1,&local_29e1,(PrimInfo *)&local_2888.field_1,
                 (PrimInfo *)&context);
      fStack_2870 = (float)uStack_2960;
      fStack_286c = uStack_2960._4_4_;
      local_29a8 = (anon_class_24_3_3a534e91 *)local_2958;
      uStack_29a0 = uStack_2950;
      local_29b8 = local_2948;
      uStack_29b0 = uStack_2940;
      local_2888._0_8_ = local_2978._0_8_;
      local_2888._8_8_ = local_2978._8_8_;
      local_2878 = local_2968;
      local_2848 = local_2938;
      sStack_2840 = sStack_2930;
      psVar8 = psVar8 + 10;
      uVar9 = local_2978.m128[0];
      uVar10 = local_2978.m128[1];
      uVar11 = local_2978.m128[2];
      uVar12 = local_2978.m128[3];
      fVar2 = (float)local_2968;
      fVar3 = local_2968._4_4_;
      local_2868 = local_29a8;
      uStack_2860 = uStack_29a0;
      local_2858 = local_29b8;
      uStack_2850 = uStack_29b0;
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
    .m128[0] = (float)uVar9;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
    .m128[1] = (float)uVar10;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
    .m128[2] = (float)uVar11;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
    .m128[3] = (float)uVar12;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
    .m128[0] = fVar2;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
    .m128[1] = fVar3;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
    .m128[2] = fStack_2870;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
    .m128[3] = fStack_286c;
    *(anon_class_24_3_3a534e91 **)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_29a8;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = uStack_29a0;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_29b8;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = uStack_29b0;
    __return_storage_ptr__->begin = local_2848;
    __return_storage_ptr__->end = sStack_2840;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray_presplit(Geometry* geometry, unsigned int geomID, size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelPrefixSumState<PrimInfo> pstate;
      
      /* first try */
      progressMonitor(0);
      PrimInfo pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
	  return geometry->createPrimRefArray(prims,r,r.begin(),geomID);
	}, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
	{
	  progressMonitor(0);
	  pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
	      return geometry->createPrimRefArray(prims,r,base.size(),geomID);
	    }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
	}
      return pinfo;	
    }